

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int noise_state_init(aom_noise_state_t *state,int n,int bit_depth)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  int kNumBins;
  aom_noise_strength_solver_t *in_stack_ffffffffffffffd8;
  int local_4;
  
  iVar1 = equation_system_init(&in_stack_ffffffffffffffd8->eqns,0);
  if (iVar1 == 0) {
    fprintf(_stderr,"Failed initialization noise state with size %d\n",(ulong)in_ESI);
    local_4 = 0;
  }
  else {
    *(undefined8 *)(in_RDI + 0x68) = 0x3ff0000000000000;
    *(undefined4 *)(in_RDI + 0x60) = 0;
    local_4 = aom_noise_strength_solver_init(in_stack_ffffffffffffffd8,0,0x3b7747);
  }
  return local_4;
}

Assistant:

static int noise_state_init(aom_noise_state_t *state, int n, int bit_depth) {
  const int kNumBins = 20;
  if (!equation_system_init(&state->eqns, n)) {
    fprintf(stderr, "Failed initialization noise state with size %d\n", n);
    return 0;
  }
  state->ar_gain = 1.0;
  state->num_observations = 0;
  return aom_noise_strength_solver_init(&state->strength_solver, kNumBins,
                                        bit_depth);
}